

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle_BeagleJNIWrapper.cpp
# Opt level: O0

jint Java_beagle_BeagleJNIWrapper_calculateRootLogLikelihoodsByPartition
               (JNIEnv *env,jobject obj,jint instance,jintArray inBufferIndices,
               jintArray inCategoryWeightsIndices,jintArray inStateFrequenciesIndices,
               jintArray inScalingIndices,jintArray inPartitionIndices,jint partitionCount,
               jint count,jdoubleArray outSumLogLikelihoodByPartition,
               jdoubleArray outSumLogLikelihoods)

{
  jint jVar1;
  jint *pjVar2;
  jint *pjVar3;
  jint *pjVar4;
  jint *pjVar5;
  jint *pjVar6;
  jdoubleArray array;
  JNIEnv_ *this;
  undefined4 in_EDX;
  undefined4 in_stack_00000018;
  undefined4 in_stack_00000020;
  jint errCode;
  jdouble *sumLogLikelihoods;
  jdouble *sumLogLikelihoodsByPartition;
  jint *partitionIndices;
  jint *scalingIndices;
  jint *frequenciesIndices;
  jint *weightsIndices;
  jint *bufferIndices;
  undefined4 in_stack_ffffffffffffff68;
  jint in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  
  pjVar2 = JNIEnv_::GetIntArrayElements
                     ((JNIEnv_ *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                      (jintArray)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (jboolean *)0x10606f);
  pjVar3 = JNIEnv_::GetIntArrayElements
                     ((JNIEnv_ *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                      (jintArray)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (jboolean *)0x10608a);
  pjVar4 = JNIEnv_::GetIntArrayElements
                     ((JNIEnv_ *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                      (jintArray)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (jboolean *)0x1060a5);
  pjVar5 = JNIEnv_::GetIntArrayElements
                     ((JNIEnv_ *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                      (jintArray)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (jboolean *)0x1060c3);
  pjVar6 = JNIEnv_::GetIntArrayElements
                     ((JNIEnv_ *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                      (jintArray)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (jboolean *)0x1060e1);
  array = (jdoubleArray)
          JNIEnv_::GetDoubleArrayElements
                    ((JNIEnv_ *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     (jdoubleArray)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                     (jboolean *)0x1060ff);
  this = (JNIEnv_ *)
         JNIEnv_::GetDoubleArrayElements
                   ((JNIEnv_ *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                    (jdoubleArray)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                    (jboolean *)0x10611d);
  jVar1 = beagleCalculateRootLogLikelihoodsByPartition
                    (in_EDX,pjVar2,pjVar3,pjVar4,pjVar5,pjVar6,in_stack_00000018);
  JNIEnv_::ReleaseDoubleArrayElements
            (this,array,(jdouble *)CONCAT44(in_stack_ffffffffffffff74,in_stack_00000020),
             in_stack_ffffffffffffff6c);
  JNIEnv_::ReleaseDoubleArrayElements
            (this,array,(jdouble *)CONCAT44(in_stack_ffffffffffffff74,in_stack_00000020),
             in_stack_ffffffffffffff6c);
  JNIEnv_::ReleaseIntArrayElements
            (this,(jintArray)array,(jint *)CONCAT44(in_stack_ffffffffffffff74,in_stack_00000020),
             in_stack_ffffffffffffff6c);
  JNIEnv_::ReleaseIntArrayElements
            (this,(jintArray)array,(jint *)CONCAT44(in_stack_ffffffffffffff74,in_stack_00000020),
             in_stack_ffffffffffffff6c);
  JNIEnv_::ReleaseIntArrayElements
            (this,(jintArray)array,(jint *)CONCAT44(in_stack_ffffffffffffff74,in_stack_00000020),
             in_stack_ffffffffffffff6c);
  JNIEnv_::ReleaseIntArrayElements
            (this,(jintArray)array,(jint *)CONCAT44(in_stack_ffffffffffffff74,in_stack_00000020),
             in_stack_ffffffffffffff6c);
  JNIEnv_::ReleaseIntArrayElements
            (this,(jintArray)array,(jint *)CONCAT44(in_stack_ffffffffffffff74,in_stack_00000020),
             in_stack_ffffffffffffff6c);
  return jVar1;
}

Assistant:

JNIEXPORT jint JNICALL Java_beagle_BeagleJNIWrapper_calculateRootLogLikelihoodsByPartition
  (JNIEnv *env, jobject obj, jint instance, jintArray inBufferIndices, jintArray inCategoryWeightsIndices, jintArray inStateFrequenciesIndices, jintArray inScalingIndices, jintArray inPartitionIndices, jint partitionCount, jint count, jdoubleArray outSumLogLikelihoodByPartition, jdoubleArray outSumLogLikelihoods)
{
    jint *bufferIndices = env->GetIntArrayElements(inBufferIndices, NULL);
    jint *weightsIndices = env->GetIntArrayElements(inCategoryWeightsIndices, NULL);
    jint *frequenciesIndices = env->GetIntArrayElements(inStateFrequenciesIndices, NULL);
    jint *scalingIndices = env->GetIntArrayElements(inScalingIndices, NULL);
    jint *partitionIndices = env->GetIntArrayElements(inPartitionIndices, NULL);

    jdouble *sumLogLikelihoodsByPartition = env->GetDoubleArrayElements(outSumLogLikelihoodByPartition, NULL);
    jdouble *sumLogLikelihoods = env->GetDoubleArrayElements(outSumLogLikelihoods, NULL);

    jint errCode = (jint)beagleCalculateRootLogLikelihoodsByPartition(
                                                           instance,
                                                           (int *)bufferIndices,
                                                           (int *)weightsIndices,
                                                           (int *)frequenciesIndices,
                                                           (int *)scalingIndices,
                                                           (int *)partitionIndices,
                                                           partitionCount,
                                                           count,
                                                           (double *)sumLogLikelihoodsByPartition,
                                                           (double *)sumLogLikelihoods);

    // not using JNI_ABORT flag here because we want the values to be copied back...
    env->ReleaseDoubleArrayElements(outSumLogLikelihoodByPartition, sumLogLikelihoodsByPartition, 0);
    env->ReleaseDoubleArrayElements(outSumLogLikelihoods, sumLogLikelihoods, 0);

    env->ReleaseIntArrayElements(inPartitionIndices, partitionIndices, JNI_ABORT);
    env->ReleaseIntArrayElements(inScalingIndices, scalingIndices, JNI_ABORT);
    env->ReleaseIntArrayElements(inStateFrequenciesIndices, frequenciesIndices, JNI_ABORT);
    env->ReleaseIntArrayElements(inCategoryWeightsIndices, weightsIndices, JNI_ABORT);
    env->ReleaseIntArrayElements(inBufferIndices, bufferIndices, JNI_ABORT);

    return errCode;
}